

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

uint crnlib::symbol_codec::encode_truncated_binary_cost(uint v,uint n)

{
  uint uVar1;
  
  uVar1 = math::floor_log2i(n);
  if ((1 << ((byte)(uVar1 + 1) & 0x1f)) - n <= v) {
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

uint symbol_codec::encode_truncated_binary_cost(uint v, uint n) {
  CRNLIB_ASSERT((n >= 2) && (v < n));

  uint k = math::floor_log2i(n);
  uint u = (1 << (k + 1)) - n;

  if (v < u)
    return k;
  else
    return k + 1;
}